

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O2

Vector * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  long index;
  Vector *pVVar1;
  double dVar2;
  double dVar3;
  pointer pMVar4;
  _func_int **__ptr;
  Index IVar5;
  bool bVar6;
  uint uVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  ulong uVar10;
  ulong index_00;
  long lVar11;
  int i;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  timespec tVar15;
  timespec tVar16;
  undefined8 local_228;
  undefined1 local_208 [72];
  Matrix3 *local_1c0;
  _Elt_pointer local_1b8;
  timespec time2;
  timespec time1;
  undefined1 local_190 [16];
  XprTypeNested pMStack_180;
  variable_if_dynamic<long,__1> local_178;
  _Map_pointer ppMStack_170;
  size_t local_168;
  _Elt_pointer pMStack_160;
  Matrix<double,__1,_1,_0,__1,_1> local_158 [3];
  _Map_pointer local_128;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  _func_int **local_110;
  undefined1 local_100 [16];
  XprTypeNested local_f0;
  variable_if_dynamic<long,__1> vStack_e8;
  size_t local_e0;
  _Elt_pointer pMStack_d8;
  Matrix3 local_d0;
  timespec time3;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_78 [24];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> local_60 [48];
  
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  if (this->on_ == true) {
    clock_gettime(2,(timespec *)&time1);
    clock_gettime(2,(timespec *)&time2);
    uVar7 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
    if (uVar7 != 0) {
      clock_gettime(2,(timespec *)&time1);
      clock_gettime(2,(timespec *)&time2);
      uVar7 = ZeroDelayObserver::getMeasurementTime((ZeroDelayObserver *)this_00);
      (this->super_EKFFlexibilityEstimatorBase).k_ = uVar7;
      uVar7 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
      while (uVar7 = uVar7 + 1, uVar7 <= (this->super_EKFFlexibilityEstimatorBase).k_) {
        if ((this->super_EKFFlexibilityEstimatorBase).finiteDifferencesJacobians_ == true) {
          KalmanFilterBase::updatePredictedMeasurement(&this_00->super_KalmanFilterBase);
          IMUElasticLocalFrameDynamicalSystem::stateDynamicsJacobian
                    ((Matrix *)local_208,&this->functor_);
          KalmanFilterBase::setA(&this_00->super_KalmanFilterBase,(Amatrix *)local_208);
          free((void *)local_208._0_8_);
          IMUElasticLocalFrameDynamicalSystem::measureDynamicsJacobian
                    ((Matrix *)local_208,&this->functor_);
          KalmanFilterBase::setC(&this_00->super_KalmanFilterBase,(Cmatrix *)local_208);
          free((void *)local_208._0_8_);
        }
        pMVar4 = (this->contactPositions_).
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->contactPositions_).
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != pMVar4) {
          (this->contactPositions_).
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
        }
        uVar12 = 0x2a;
        for (uVar10 = 0; uVar10 < (this->functor_).nbContacts_; uVar10 = uVar10 + 1) {
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0xe])((Matrix<double,__1,_1,_0,__1,_1> *)local_190);
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_208,
                     (Matrix<double,__1,_1,_0,__1,_1> *)local_190,(ulong)uVar12,3);
          Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
                    ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_d0,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)local_208);
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)&this->contactPositions_,(Matrix<double,_3,_1,_0,_3,_1> *)&local_d0);
          free((void *)local_190._0_8_);
          uVar12 = uVar12 + 0xc;
        }
        ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)&local_110,(uint)this_00);
        free(local_110);
      }
      ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_208,(uint)this_00);
      __ptr = (_func_int **)
              (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
      (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)local_208._0_8_;
      IVar5 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
      (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           local_208._8_8_;
      local_208._0_8_ = __ptr;
      local_208._8_8_ = IVar5;
      free(__ptr);
      bVar6 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::hasNaN
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_);
      pVVar1 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
      if (bVar6) {
        ZeroDelayObserver::setState
                  ((ZeroDelayObserver *)this_00,pVVar1,(this->super_EKFFlexibilityEstimatorBase).k_)
        ;
        if (1 < (this->super_EKFFlexibilityEstimatorBase).k_) {
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x17])(this);
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x3e])(this);
        }
      }
      else {
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  (pVVar1,&this->x_);
        lVar11 = 3;
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_208,pVVar1,3,3);
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_190,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
                   )local_208);
        kine::regulateOrientationVector((kine *)local_158,(Vector3 *)local_190);
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_d0,pVVar1,3,3);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_d0,
                   local_158);
        free((void *)CONCAT44(local_158[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              (uint)local_158[0].
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_data));
        if (this->limitOn_ == true) {
          uVar10 = 0;
          while (bVar6 = lVar11 != 0, lVar11 = lVar11 + -1, bVar6) {
            index = uVar10 + 0x12;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index);
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitTorques_,uVar10);
            dVar2 = *pSVar9;
            uVar13 = SUB84(dVar2,0);
            uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
            dVar3 = *pSVar8;
            if (dVar3 <= dVar2) {
              uVar13 = SUB84(dVar3,0);
              uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
            }
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index);
            *pSVar8 = (Scalar)CONCAT44(uVar14,uVar13);
            index_00 = uVar10 | 0xc;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index_00);
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitForces_,uVar10);
            dVar2 = *pSVar9;
            uVar13 = SUB84(dVar2,0);
            uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
            dVar3 = *pSVar8;
            if (dVar3 <= dVar2) {
              uVar13 = SUB84(dVar3,0);
              uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
            }
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index_00);
            *pSVar8 = (Scalar)CONCAT44(uVar14,uVar13);
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index);
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitTorques_,uVar10);
            dVar3 = (double)((ulong)*pSVar9 ^ (ulong)DAT_0020b250);
            uVar13 = SUB84(dVar3,0);
            uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
            dVar2 = *pSVar8;
            if (dVar3 <= dVar2) {
              uVar13 = SUB84(dVar2,0);
              uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            local_228 = (Scalar)CONCAT44(uVar14,uVar13);
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index);
            *pSVar8 = local_228;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index_00);
            pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitForces_,uVar10);
            dVar3 = (double)((ulong)*pSVar9 ^ (ulong)DAT_0020b250);
            uVar13 = SUB84(dVar3,0);
            uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
            dVar2 = *pSVar8;
            if (dVar3 <= dVar2) {
              uVar13 = SUB84(dVar2,0);
              uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
            }
            local_228 = (Scalar)CONCAT44(uVar14,uVar13);
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1
                                ,index_00);
            *pSVar8 = local_228;
            uVar10 = uVar10 + 1;
          }
        }
        uVar7 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
        ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,pVVar1,uVar7);
      }
    }
    clock_gettime(2,(timespec *)&time3);
    tVar15 = diff(&time2,&time3);
    tVar16 = diff(&time1,&time2);
    this->computeFlexibilityTime_ = (double)tVar15.tv_nsec - (double)tVar16.tv_nsec;
    pVVar1 = &this->x_;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_208,pVVar1,6,3);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3,_1,_false>_>::setZero
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
               local_208);
    lVar11 = 0;
    for (uVar10 = 0; uVar10 < (this->functor_).nbContacts_; uVar10 = uVar10 + 1) {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_158,pVVar1,3,3);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
                (local_78,(DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                           *)local_158);
      kine::rotationVectorToRotationMatrix(&local_d0,(Vector3 *)local_78);
      local_1b8 = (_Elt_pointer)
                  ((long)(((this->contactPositions_).
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                         m_data.array + lVar11);
      local_1c0 = &local_d0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_128,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)&local_1c0);
      local_208._0_8_ = (_func_int **)0x0;
      local_208._20_4_ = uStack_11c ^ 0x80000000;
      local_208._28_4_ = uStack_114 ^ 0x80000000;
      local_208._16_4_ = local_120;
      local_208._24_4_ = uStack_118;
      local_208._32_8_ = (double *)0x0;
      local_208._56_4_ = SUB84(local_128,0);
      local_208._40_8_ = local_128;
      local_208._60_4_ = (uint)((ulong)local_128 >> 0x20) ^ 0x80000000;
      local_208._48_4_ = local_120;
      local_208._52_4_ = uStack_11c;
      local_208._64_8_ = (_Map_pointer)0x0;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_100,pVVar1,9,3);
      local_190._0_8_ = local_208;
      local_168 = local_e0;
      pMStack_160 = pMStack_d8;
      local_178.m_value = (long)local_f0;
      ppMStack_170 = (_Map_pointer)vStack_e8.m_value;
      local_190._8_8_ = local_100._0_8_;
      pMStack_180 = (XprTypeNested)local_100._8_8_;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_60,pVVar1,6,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
                (local_60,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>_>
                           *)local_190);
      lVar11 = lVar11 + 0x18;
    }
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_d0,pVVar1,6,3);
    local_158[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data.
    _0_4_ = (this->functor_).nbContacts_;
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator/
              ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_208,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_d0,
               (uint *)local_158);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_190,pVVar1,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_190,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_208);
  }
  else {
    pVVar1 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVVar1);
    uVar7 = ZeroDelayObserver::getCurrentTime((ZeroDelayObserver *)this_00);
    ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,pVVar1,uVar7);
    uVar7 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
    if (uVar7 != 0) {
      ZeroDelayObserver::clearMeasurements((ZeroDelayObserver *)this_00);
      ZeroDelayObserver::clearInputs((ZeroDelayObserver *)this_00);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])(this);
    }
  }
  (this->functor_).printed_ = false;
  return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
}

Assistant:

const Vector & ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector()
    {
      timespec time1, time2, time3;

      if(on_==true)
      {
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
        if (ekf_.getMeasurementsNumber()>0)
        {
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
          k_=ekf_.getMeasurementTime();

          unsigned i;
          for (i=ekf_.getCurrentTime()+1; i<=k_; ++i)
          {
            if (finiteDifferencesJacobians_)
            {
              ekf_.updatePredictedMeasurement();///triggers also ekf_.updatePrediction();

              //ekf_.setA(ekf_.getAMatrixFD(dx_));
              //ekf_.setC(ekf_.getCMatrixFD(dx_));
              ekf_.setA(functor_.stateDynamicsJacobian());
              ekf_.setC(functor_.measureDynamicsJacobian());
            }

            ///regulate the part of orientation vector in the state vector
            ///temporary code
            contactPositions_.clear();
            for (unsigned i = 0; i<functor_.getContactsNumber() ; ++i)
            {
              contactPositions_.push_back(getInput().segment<3>(42 + 12*i));
            }
            ekf_.getEstimatedState(i);
          }
          x_=ekf_.getEstimatedState(k_);
#ifndef EIGEN_VERSION_LESS_THAN_3_2
          if (! x_.hasNaN())//detect NaN values
          {
#else
          if (x_==x_)//detect NaN values
          {
#endif // EIGEN_VERSION_LESS_THAN_3_2
            lastX_=x_;

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(state::ori,3)=kine::regulateOrientationVector(lastX_.segment(state::ori,3));
            if(limitOn_)
            {
              for(int i=0; i<3; i++)
              {
                // Saturation for bounded forces and torques
                lastX_[state::fc+6+i]=std::min(lastX_[state::fc+6+i],limitTorques_[i]);
                lastX_[state::fc+i]=std::min(lastX_[state::fc+i],limitForces_[i]);
                lastX_[state::fc+6+i]=std::max(lastX_[state::fc+6+i],-limitTorques_[i]);
                lastX_[state::fc+i]=std::max(lastX_[state::fc+i],-limitForces_[i]);
              }
            }
            ekf_.setState(lastX_,ekf_.getCurrentTime());
          }
          else //delete NaN values
          {
            ekf_.setState(lastX_,k_);

            if(k_>1) //the first iteration give always nan when not
              //initialized
            {
              resetCovarianceMatrices();
              resetStateCovarianceMatrix();
            }
          }
        }
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time3);

        computeFlexibilityTime_=(double)diff(time2,time3).tv_nsec-(double)diff(time1,time2).tv_nsec;

        // To be deleted: constrain the internal linear velocity of the flexibility of each foot to zero.
        x_.segment<3>(state::linVel).setZero();
        for(int i=0; i<functor_.getContactsNumber();++i)
        {
          x_.segment<3>(state::linVel) += kine::skewSymmetric(kine::rotationVectorToRotationMatrix(x_.segment<3>(state::ori))*contactPositions_[i])*x_.segment<3>(state::angVel);
        }
        x_.segment<3>(state::linVel)=x_.segment<3>(state::linVel)/functor_.getContactsNumber();
      }
      else
      {
        lastX_.setZero();
        ekf_.setState(lastX_,ekf_.getCurrentTime());

        if (ekf_.getMeasurementsNumber()>0)
        {
          ekf_.clearMeasurements();
          ekf_.clearInputs();
          resetStateCovarianceMatrix();
        }
      }

      functor_.setPrinted(false);
      return lastX_;
    }

    stateObservation::Matrix& ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
    {
        op_.O.resize(getMeasurementSize()*2,getStateSize());
        op_.CA.resize(getMeasurementSize(),getStateSize());
        op_.CA  = ekf_.getC();
        op_.O.block(0,0,getMeasurementSize(),getStateSize()) = op_.CA;
        op_.CA = op_.CA * ekf_.getA();
        op_.O.block(getMeasurementSize(),0,getMeasurementSize(),getStateSize()) = op_.CA;
        return op_.O;
    }

    void ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(double dt)
    {
        dt_=dt;
        functor_.setSamplingPeriod(dt);
    }

    /// Enable or disable the estimation
    void ModelBaseEKFFlexEstimatorIMU::setOn(bool & b)
    {
        on_=b;
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfe(const Matrix3 & m)
    {
        functor_.setKfe(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfv(const Matrix3 & m)
    {
        functor_.setKfv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKte(const Matrix3 & m)
    {
        functor_.setKte(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtv(const Matrix3 & m)
    {
        functor_.setKtv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfeRopes(const Matrix3 & m)
    {
        functor_.setKfeRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfvRopes(const Matrix3 & m)
    {
        functor_.setKfvRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKteRopes(const Matrix3 & m)
    {
        functor_.setKteRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtvRopes(const Matrix3 & m)
    {
        functor_.setKtvRopes(m);
	}

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfe() const
    {
        return functor_.getKfe();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfv() const
    {
        return functor_.getKfv();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKte() const
    {
        return functor_.getKte();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKtv() const
    {
        return functor_.getKtv();
    }

    double& ModelBaseEKFFlexEstimatorIMU::getComputeFlexibilityTime()
    {
        return computeFlexibilityTime_;
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements(bool b)
    {
      if (useFTSensors_!= b)
      {
        useFTSensors_=b;
        functor_.setWithForceMeasurements(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());

        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos(bool b)
    {
      if (withAbsolutePos_!= b)
      {
        functor_.setWithAbsolutePosition(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        withAbsolutePos_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
    {
      if (withUnmodeledForces_!= b)
      {
        functor_.setWithUnmodeledForces(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setInputSize(functor_.getInputSize());
        withUnmodeledForces_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    bool ModelBaseEKFFlexEstimatorIMU::getWithForcesMeasurements()
    {
        return useFTSensors_;
    }


    void ModelBaseEKFFlexEstimatorIMU::setWithComBias(bool b)
    {
      if (withComBias_!= b)
      {
        withComBias_=b;
        functor_.setWithComBias(b);
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceProcessVariance(double d)
    {
        Q_.diagonal().segment<6>(state::unmodeledForces).setConstant(d);
        ekf_.setQ(Q_);
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
    }

    void ModelBaseEKFFlexEstimatorIMU::setForceVariance(double d)
    {
        forceVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance(double d)
    {
        absPosVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setRobotMass(double m)
    {
        functor_.setRobotMass(m);
    }

}